

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

void sq_pushobject(HSQUIRRELVM v,HSQOBJECT obj)

{
  SQObjectPtr *in_RDI;
  SQVM *this;
  undefined1 local_28 [40];
  
  this = (SQVM *)local_28;
  SQObjectPtr::SQObjectPtr((SQObjectPtr *)this,(SQObject *)(local_28 + 0x18));
  SQVM::Push(this,in_RDI);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this);
  return;
}

Assistant:

void sq_pushobject(HSQUIRRELVM v,HSQOBJECT obj)
{
    v->Push(SQObjectPtr(obj));
}